

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

string * __thiscall
pbrt::HaltonSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,HaltonSampler *this)

{
  int *in_stack_ffffffffffffffe0;
  
  StringPrintf<pbrt::RandomizeStrategy_const&,pstd::vector<pbrt::DigitPermutation,pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>>*const&,long_const&,int_const&,int_const&,pbrt::Point2<int>const&,pbrt::Point2<int>const&,int_const&,int_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ HaltonSampler randomizeStrategy: %s digitPermutations: %p haltonIndex: %d dimension: %d samplesPerPixel: %d baseScales: %s baseExponents: %s multInverse: [ %d %d ] ]"
             ,(char *)&this->randomizeStrategy,(RandomizeStrategy *)&this->digitPermutations,
             (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
              **)&this->haltonIndex,(long *)&this->dimension,&this->samplesPerPixel,
             (int *)&this->baseScales,&this->baseExponents,(Point2<int> *)this->multInverse,
             this->multInverse + 1,in_stack_ffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

std::string HaltonSampler::ToString() const {
    return StringPrintf("[ HaltonSampler randomizeStrategy: %s digitPermutations: %p "
                        "haltonIndex: %d dimension: %d samplesPerPixel: %d "
                        "baseScales: %s baseExponents: %s multInverse: [ %d %d ] ]",
                        randomizeStrategy, digitPermutations, haltonIndex, dimension,
                        samplesPerPixel, baseScales, baseExponents, multInverse[0],
                        multInverse[1]);
}